

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestExtremeDefaultValues::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 *puVar5;
  Nonnull<const_char_*> pcVar6;
  Arena *pAVar7;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  
  if (from_msg == to_msg) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      puVar5 = (undefined8 *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value._M_str = pcVar2;
      value._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,value,pAVar7);
    }
    if ((uVar1 & 2) != 0) {
      puVar5 = (undefined8 *)((ulong)from_msg[2]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_00._M_str = pcVar2;
      value_00._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(to_msg + 2),value_00,pAVar7);
    }
    if ((uVar1 & 4) != 0) {
      puVar5 = (undefined8 *)(from_msg[2]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_01._M_str = pcVar2;
      value_01._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)&to_msg[2]._internal_metadata_,value_01,pAVar7);
    }
    if ((uVar1 & 8) != 0) {
      puVar5 = (undefined8 *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 8;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_02._M_str = pcVar2;
      value_02._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(to_msg + 3),value_02,pAVar7);
    }
    if ((uVar1 & 0x10) != 0) {
      puVar5 = (undefined8 *)(from_msg[3]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_03._M_str = pcVar2;
      value_03._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,value_03,pAVar7);
    }
    if ((uVar1 & 0x20) != 0) {
      puVar5 = (undefined8 *)((ulong)from_msg[4]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x20;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_04._M_str = pcVar2;
      value_04._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(to_msg + 4),value_04,pAVar7);
    }
    if ((uVar1 & 0x40) != 0) {
      uVar4 = from_msg[4]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x40;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,
                 (string *)(uVar4 & 0xfffffffffffffffc),pAVar7);
    }
    if ((char)uVar1 < '\0') {
      puVar5 = (undefined8 *)((ulong)from_msg[5]._vptr_MessageLite & 0xfffffffffffffffc);
      pcVar2 = (char *)*puVar5;
      sVar3 = puVar5[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x80;
      pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar7 & 1) != 0) {
        pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
      }
      value_05._M_str = pcVar2;
      value_05._M_len = sVar3;
      google::protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)(to_msg + 5),value_05,pAVar7);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      *(int *)&to_msg[5]._internal_metadata_.ptr_ = (int)from_msg[5]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      to_msg[6]._vptr_MessageLite = from_msg[6]._vptr_MessageLite;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      *(int *)&to_msg[6]._internal_metadata_.ptr_ = (int)from_msg[6]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      *(undefined4 *)((long)&to_msg[6]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[6]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      to_msg[7]._vptr_MessageLite = from_msg[7]._vptr_MessageLite;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      *(int *)&to_msg[7]._internal_metadata_.ptr_ = (int)from_msg[7]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      *(undefined4 *)((long)&to_msg[7]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[7]._internal_metadata_.ptr_ + 4);
    }
    if ((short)uVar1 < 0) {
      *(undefined4 *)&to_msg[8]._vptr_MessageLite = *(undefined4 *)&from_msg[8]._vptr_MessageLite;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[8]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[8]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      *(int *)&to_msg[8]._internal_metadata_.ptr_ = (int)from_msg[8]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[8]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[8]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      to_msg[9]._vptr_MessageLite = from_msg[9]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      to_msg[9]._internal_metadata_.ptr_ = from_msg[9]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x15 & 1) != 0) {
      to_msg[10]._vptr_MessageLite = from_msg[10]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x16 & 1) != 0) {
      *(int *)&to_msg[10]._internal_metadata_.ptr_ = (int)from_msg[10]._internal_metadata_.ptr_;
    }
    if ((uVar1 >> 0x17 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[10]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[10]._internal_metadata_.ptr_ + 4);
    }
  }
  if ((uVar1 & 0x7000000) != 0) {
    if ((uVar1 >> 0x18 & 1) != 0) {
      *(undefined4 *)&to_msg[0xb]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0xb]._vptr_MessageLite;
    }
    if ((uVar1 >> 0x19 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0xb]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[0xb]._vptr_MessageLite + 4);
    }
    if ((uVar1 >> 0x1a & 1) != 0) {
      to_msg[0xb]._internal_metadata_.ptr_ = from_msg[0xb]._internal_metadata_.ptr_;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar4 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar4 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestExtremeDefaultValues::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestExtremeDefaultValues*>(&to_msg);
  auto& from = static_cast<const TestExtremeDefaultValues&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestExtremeDefaultValues)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_escaped_bytes(from._internal_escaped_bytes());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_utf8_string(from._internal_utf8_string());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cpp_trigraph(from._internal_cpp_trigraph());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_string_with_zero(from._internal_string_with_zero());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_bytes_with_zero(from._internal_bytes_with_zero());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_string_piece_with_zero(from._internal_string_piece_with_zero());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_cord_with_zero(from._internal_cord_with_zero());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_replacement_string(from._internal_replacement_string());
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.zero_float_ = from._impl_.zero_float_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.large_uint64_ = from._impl_.large_uint64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.large_uint32_ = from._impl_.large_uint32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.small_int32_ = from._impl_.small_int32_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.small_int64_ = from._impl_.small_int64_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.one_float_ = from._impl_.one_float_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.small_float_ = from._impl_.small_float_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.negative_one_float_ = from._impl_.negative_one_float_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.negative_float_ = from._impl_.negative_float_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.large_float_ = from._impl_.large_float_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.small_negative_float_ = from._impl_.small_negative_float_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.inf_double_ = from._impl_.inf_double_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.neg_inf_double_ = from._impl_.neg_inf_double_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.nan_double_ = from._impl_.nan_double_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.inf_float_ = from._impl_.inf_float_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.neg_inf_float_ = from._impl_.neg_inf_float_;
    }
  }
  if ((cached_has_bits & 0x07000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.nan_float_ = from._impl_.nan_float_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.really_small_int32_ = from._impl_.really_small_int32_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.really_small_int64_ = from._impl_.really_small_int64_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}